

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

ll_node * ll_from_array(void *ptr,size_t isize,size_t n)

{
  ll_node *plVar1;
  ll_node *plVar2;
  void *item_ptr;
  ll_node *plVar3;
  ll_node *plVar4;
  
  plVar1 = (ll_node *)0x0;
  if (((ptr != (void *)0x0) && (isize != 0)) && (n != 0)) {
    plVar3 = (ll_node *)0x0;
    plVar4 = (ll_node *)0x0;
    do {
      plVar2 = ll_create_node(ptr,isize);
      plVar1 = plVar2;
      if (plVar3 != (ll_node *)0x0) {
        plVar3->next = plVar2;
        plVar1 = plVar4;
      }
      ptr = (void *)((long)ptr + isize);
      n = n - 1;
      plVar3 = plVar2;
      plVar4 = plVar1;
    } while (n != 0);
  }
  return plVar1;
}

Assistant:

struct ll_node *ll_from_array(const void *ptr, size_t isize, size_t n)
{
	struct ll_node *root_node = NULL;
	struct ll_node *prev_node = NULL;
	struct ll_node *cur_node = NULL;
	void *item_ptr = (void *)ptr;
	int i;
	if (n <= 0 || isize <= 0 || ptr == NULL) {
		return NULL;
	}
	for (i = 0; i < n; i++) {
		if (cur_node == NULL) {
			cur_node = ll_create_node(item_ptr, isize);
			root_node = cur_node;
		} else {
			prev_node = cur_node;
			cur_node = ll_create_node(item_ptr, isize);
			if (prev_node != NULL) {
				prev_node->next = cur_node;
			}
		}
		item_ptr += isize;
	}
	return root_node;
}